

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::text_format_unittest::TextFormatTest_PopulatesNoOpFields_Test::
~TextFormatTest_PopulatesNoOpFields_Test(TextFormatTest_PopulatesNoOpFields_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_TextFormatTest).super_TextFormatTestBase.super_Test._vptr_Test =
       (_func_int **)&PTR__TextFormatTest_0191e068;
  pcVar2 = (this->super_TextFormatTest).proto_text_format_._M_dataplus._M_p;
  paVar1 = &(this->super_TextFormatTest).proto_text_format_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  (this->super_TextFormatTest).super_TextFormatTestBase.super_Test._vptr_Test =
       (_func_int **)&PTR__TextFormatTestBase_0191e0a8;
  pcVar2 = (this->super_TextFormatTest).super_TextFormatTestBase.multi_line_debug_format_prefix_.
           _M_dataplus._M_p;
  paVar1 = &(this->super_TextFormatTest).super_TextFormatTestBase.multi_line_debug_format_prefix_.
            field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->super_TextFormatTest).super_TextFormatTestBase.single_line_debug_format_prefix_.
           _M_dataplus._M_p;
  paVar1 = &(this->super_TextFormatTest).super_TextFormatTestBase.single_line_debug_format_prefix_.
            field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  proto2_unittest::TestAllTypes::~TestAllTypes
            (&(this->super_TextFormatTest).super_TextFormatTestBase.proto_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x3b0);
  return;
}

Assistant:

TEST_F(TextFormatTest, PopulatesNoOpFields) {
  proto3_unittest::TestAllTypes proto;
  TextFormat::Parser parser;
  TextFormat::Parser::UnsetFieldsMetadata no_op_fields;
  parser.OutputNoOpFields(&no_op_fields);
  using Peer = UnsetFieldsMetadataTextFormatTestUtil;

  {
    no_op_fields = {};
    const absl::string_view singular_int_parse_string = "optional_int32: 0";
    EXPECT_TRUE(TextFormat::ParseFromString(singular_int_parse_string, &proto));
    EXPECT_TRUE(parser.ParseFromString(singular_int_parse_string, &proto));
    EXPECT_THAT(Peer::GetRawIds(no_op_fields),
                UnorderedElementsAre(Peer::GetId(proto, "optional_int32")));
  }
  {
    no_op_fields = {};
    const absl::string_view singular_bool_parse_string = "optional_bool: false";
    EXPECT_TRUE(
        TextFormat::ParseFromString(singular_bool_parse_string, &proto));
    EXPECT_TRUE(parser.ParseFromString(singular_bool_parse_string, &proto));
    EXPECT_THAT(Peer::GetRawIds(no_op_fields),
                UnorderedElementsAre(Peer::GetId(proto, "optional_bool")));
  }
  {
    no_op_fields = {};
    const absl::string_view singular_string_parse_string =
        "optional_string: ''";
    EXPECT_TRUE(
        TextFormat::ParseFromString(singular_string_parse_string, &proto));
    EXPECT_TRUE(parser.ParseFromString(singular_string_parse_string, &proto));
    EXPECT_THAT(Peer::GetRawIds(no_op_fields),
                UnorderedElementsAre(Peer::GetId(proto, "optional_string")));
  }
  {
    no_op_fields = {};
    const absl::string_view nested_message_parse_string =
        "optional_nested_message { bb: 0 } ";
    EXPECT_TRUE(
        TextFormat::ParseFromString(nested_message_parse_string, &proto));
    EXPECT_TRUE(parser.ParseFromString(nested_message_parse_string, &proto));
    EXPECT_THAT(Peer::GetRawIds(no_op_fields),
                UnorderedElementsAre(
                    Peer::GetId(proto.optional_nested_message(), "bb")));
  }
  {
    no_op_fields = {};
    const absl::string_view nested_message_parse_string =
        "optional_nested_message { bb: 1 } ";
    EXPECT_TRUE(
        TextFormat::ParseFromString(nested_message_parse_string, &proto));
    EXPECT_TRUE(parser.ParseFromString(nested_message_parse_string, &proto));
    EXPECT_THAT(Peer::GetRawIds(no_op_fields), UnorderedElementsAre());
  }
  {
    no_op_fields = {};
    const absl::string_view foreign_message_parse_string =
        "optional_foreign_message { c: 0 } ";
    EXPECT_TRUE(
        TextFormat::ParseFromString(foreign_message_parse_string, &proto));
    EXPECT_TRUE(parser.ParseFromString(foreign_message_parse_string, &proto));
    EXPECT_THAT(Peer::GetRawIds(no_op_fields),
                UnorderedElementsAre(
                    Peer::GetId(proto.optional_foreign_message(), "c")));
  }
  {
    no_op_fields = {};
    const absl::string_view nested_enum_parse_string =
        "optional_nested_enum: ZERO ";
    EXPECT_TRUE(TextFormat::ParseFromString(nested_enum_parse_string, &proto));
    EXPECT_TRUE(parser.ParseFromString(nested_enum_parse_string, &proto));
    EXPECT_THAT(
        Peer::GetRawIds(no_op_fields),
        UnorderedElementsAre(Peer::GetId(proto, "optional_nested_enum")));
  }
  {
    no_op_fields = {};
    const absl::string_view foreign_enum_parse_string =
        "optional_foreign_enum: FOREIGN_ZERO ";
    EXPECT_TRUE(TextFormat::ParseFromString(foreign_enum_parse_string, &proto));
    EXPECT_TRUE(parser.ParseFromString(foreign_enum_parse_string, &proto));
    EXPECT_THAT(
        Peer::GetRawIds(no_op_fields),
        UnorderedElementsAre(Peer::GetId(proto, "optional_foreign_enum")));
  }
  {
    no_op_fields = {};
    const absl::string_view string_piece_parse_string =
        "optional_string_piece: '' ";
    EXPECT_TRUE(TextFormat::ParseFromString(string_piece_parse_string, &proto));
    EXPECT_TRUE(parser.ParseFromString(string_piece_parse_string, &proto));
    EXPECT_THAT(
        Peer::GetRawIds(no_op_fields),
        UnorderedElementsAre(Peer::GetId(proto, "optional_string_piece")));
  }
  {
    no_op_fields = {};
    const absl::string_view cord_parse_string = "optional_cord: '' ";
    EXPECT_TRUE(TextFormat::ParseFromString(cord_parse_string, &proto));
    EXPECT_TRUE(parser.ParseFromString(cord_parse_string, &proto));
    EXPECT_THAT(Peer::GetRawIds(no_op_fields),
                UnorderedElementsAre(Peer::GetId(proto, "optional_cord")));
  }
  {
    no_op_fields = {};
    // Sanity check that repeated fields work the same.
    const absl::string_view repeated_int32_parse_string = "repeated_int32: 0 ";
    EXPECT_TRUE(
        TextFormat::ParseFromString(repeated_int32_parse_string, &proto));
    EXPECT_TRUE(parser.ParseFromString(repeated_int32_parse_string, &proto));
    EXPECT_THAT(Peer::GetRawIds(no_op_fields), UnorderedElementsAre());
  }
  {
    no_op_fields = {};
    const absl::string_view repeated_bool_parse_string =
        "repeated_bool: false  ";
    EXPECT_TRUE(
        TextFormat::ParseFromString(repeated_bool_parse_string, &proto));
    EXPECT_TRUE(parser.ParseFromString(repeated_bool_parse_string, &proto));
    EXPECT_THAT(Peer::GetRawIds(no_op_fields), UnorderedElementsAre());
  }
  {
    no_op_fields = {};
    const absl::string_view repeated_string_parse_string =
        "repeated_string: '' ";
    EXPECT_TRUE(
        TextFormat::ParseFromString(repeated_string_parse_string, &proto));
    EXPECT_TRUE(parser.ParseFromString(repeated_string_parse_string, &proto));
    EXPECT_THAT(Peer::GetRawIds(no_op_fields), UnorderedElementsAre());
  }
}